

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O2

vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_> *
benchmark::ComputeStats
          (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *__return_storage_ptr__,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *reports)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 auVar1 [16];
  pointer pRVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  __type_conflict _Var6;
  bool bVar7;
  pointer pRVar8;
  difference_type __n;
  long lVar9;
  pointer pRVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Run stddev_data;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  Stat1<double,_long> local_268;
  Stat1<double,_long> local_248;
  Stat1<double,_long> local_228;
  Stat1<double,_long> local_208;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [24];
  undefined1 local_1c0 [32];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  bool local_180;
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  int64_t local_158;
  TimeUnit local_150;
  undefined1 local_148 [16];
  double local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 auStack_128 [12];
  int local_110;
  undefined2 local_10c;
  undefined1 local_108 [32];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  bool local_c8;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  int64_t local_a0;
  TimeUnit local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [12];
  undefined4 uStack_74;
  undefined1 auStack_70 [12];
  int local_58;
  undefined2 local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar2 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = 0;
  pRVar10 = (reports->
            super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            )._M_impl.super__Vector_impl_data._M_start;
  for (pRVar8 = pRVar10; pRVar8 != pRVar2; pRVar8 = pRVar8 + 1) {
    lVar9 = lVar9 + (ulong)pRVar8->error_occurred;
  }
  if (1 < (ulong)(((long)pRVar2 - (long)pRVar10) / 0xb8 - lVar9)) {
    local_208.sum_squares_ = 0.0;
    local_228.sum_squares_ = 0.0;
    local_208.numsamples_ = 0;
    local_208.sum_ = 0.0;
    local_248.sum_squares_ = 0.0;
    local_228.numsamples_ = 0;
    local_228.sum_ = 0.0;
    local_268.sum_squares_ = 0.0;
    local_248.numsamples_ = 0;
    local_248.sum_ = 0.0;
    local_298 = (undefined1  [16])0x0;
    local_268.numsamples_ = 0;
    local_268.sum_ = 0.0;
    lVar9 = pRVar10->iterations;
    local_2a8 = (undefined1  [16])0x0;
    local_288 = (undefined1  [16])0x0;
    local_278 = (undefined1  [16])0x0;
    local_1d8._0_16_ = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    for (; pRVar10 != pRVar2; pRVar10 = pRVar10 + 1) {
      _Var6 = std::operator==(&((reports->
                                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                                )._M_impl.super__Vector_impl_data._M_start)->benchmark_name,
                              &pRVar10->benchmark_name);
      if (!_Var6) {
        internal::CheckHandler::CheckHandler
                  ((CheckHandler *)local_108,"(reports[0].benchmark_name) == (run.benchmark_name)",
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/complexity.cc"
                   ,"ComputeStats",0xb2);
        internal::CheckHandler::~CheckHandler((CheckHandler *)local_108);
      }
      internal::GetNullLogInstance();
      if (lVar9 != pRVar10->iterations) {
        internal::CheckHandler::CheckHandler
                  ((CheckHandler *)local_108,"(run_iterations) == (run.iterations)",
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/complexity.cc"
                   ,"ComputeStats",0xb3);
        internal::CheckHandler::~CheckHandler((CheckHandler *)local_108);
      }
      internal::GetNullLogInstance();
      if (pRVar10->error_occurred == false) {
        local_248.numsamples_ = pRVar10->iterations;
        dVar13 = (double)local_248.numsamples_;
        auVar1._0_8_ = pRVar10->real_accumulated_time;
        auVar1._8_8_ = pRVar10->cpu_accumulated_time;
        auVar3._8_4_ = SUB84(dVar13,0);
        auVar3._0_8_ = dVar13;
        auVar3._12_4_ = (int)((ulong)dVar13 >> 0x20);
        auVar14 = divpd(auVar1,auVar3);
        dVar12 = auVar14._0_8_;
        dVar20 = auVar14._8_8_;
        local_208.sum_ = (double)local_2a8._0_8_ + dVar12 * dVar13;
        local_228.sum_ = (double)local_2a8._8_8_ + dVar20 * dVar13;
        auVar21._8_4_ = (int)local_248.numsamples_;
        auVar21._0_8_ = local_248.numsamples_;
        auVar21._12_4_ = (int)((ulong)local_248.numsamples_ >> 0x20);
        local_208.numsamples_ = local_298._0_8_ + local_248.numsamples_;
        local_228.numsamples_ = local_298._8_8_ + auVar21._8_8_;
        local_298._8_8_ = local_228.numsamples_;
        local_298._0_8_ = local_208.numsamples_;
        dVar4 = pRVar10->bytes_per_second;
        dVar5 = pRVar10->items_per_second;
        local_248.sum_ = (double)local_278._0_8_ + dVar4 * dVar13;
        local_268.sum_ = (double)local_278._8_8_ + dVar5 * dVar13;
        local_248.numsamples_ = local_288._0_8_ + local_248.numsamples_;
        local_268.numsamples_ = local_288._8_8_ + auVar21._8_8_;
        local_248.sum_squares_ = (double)local_1d8._0_8_ + dVar4 * dVar4 * dVar13;
        local_268.sum_squares_ = (double)local_1d8._8_8_ + dVar5 * dVar5 * dVar13;
        local_208.sum_squares_ = (double)local_1e8._0_8_ + dVar12 * dVar12 * dVar13;
        local_228.sum_squares_ = (double)local_1e8._8_8_ + dVar20 * dVar20 * dVar13;
        local_2a8._8_8_ = local_228.sum_;
        local_2a8._0_8_ = local_208.sum_;
        local_1e8._8_8_ = local_228.sum_squares_;
        local_1e8._0_8_ = local_208.sum_squares_;
        local_1d8._8_4_ = SUB84(local_268.sum_squares_,0);
        local_1d8._0_8_ = local_248.sum_squares_;
        local_1d8._12_4_ = (int)((ulong)local_268.sum_squares_ >> 0x20);
        local_288._8_8_ = local_268.numsamples_;
        local_288._0_8_ = local_248.numsamples_;
        local_278._8_8_ = local_268.sum_;
        local_278._0_8_ = local_248.sum_;
      }
    }
    local_108._0_8_ = local_108 + 0x10;
    local_108._8_8_ = 0;
    local_108[0x10] = '\0';
    local_e8._M_p = (pointer)&local_d8;
    local_e0 = 0;
    local_d8._M_local_buf[0] = '\0';
    local_c8 = false;
    local_c0._M_p = (pointer)&local_b0;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_a0 = 1;
    local_98 = kNanosecond;
    local_58 = 0;
    local_54._0_1_ = false;
    local_54._1_1_ = false;
    local_90 = (undefined1  [16])0x0;
    local_80 = SUB1612((undefined1  [16])0x0,0);
    uStack_74 = 0;
    auStack_70 = SUB1612((undefined1  [16])0x0,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                   &((reports->
                     super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     )._M_impl.super__Vector_impl_data._M_start)->benchmark_name,"_mean");
    std::__cxx11::string::operator=((string *)local_108,(string *)local_1c0);
    std::__cxx11::string::~string((string *)local_1c0);
    auVar15._0_8_ = (double)(long)local_298._0_8_;
    auVar15._8_8_ = (double)(long)local_298._8_8_;
    auVar14 = divpd(_DAT_0013b5c0,auVar15);
    auVar23._0_4_ = -(uint)(local_298._0_4_ == 0);
    auVar23._4_4_ = -(uint)(local_298._4_4_ == 0);
    auVar23._8_4_ = -(uint)(local_298._8_4_ == 0);
    auVar23._12_4_ = -(uint)(local_298._12_4_ == 0);
    auVar16._4_4_ = auVar23._0_4_;
    auVar16._0_4_ = auVar23._4_4_;
    auVar16._8_4_ = auVar23._12_4_;
    auVar16._12_4_ = auVar23._8_4_;
    auVar17._8_8_ = (double)local_2a8._8_8_ * auVar14._8_8_;
    auVar17._0_8_ = (double)local_2a8._0_8_ * auVar14._0_8_;
    auVar17 = ~(auVar16 & auVar23) & auVar17;
    dVar13 = (double)lVar9 * auVar17._8_8_;
    local_90._8_4_ = SUB84(dVar13,0);
    local_90._0_8_ = (double)lVar9 * auVar17._0_8_;
    local_90._12_4_ = (int)((ulong)dVar13 >> 0x20);
    auVar18._0_8_ = (double)(long)local_288._0_8_;
    auVar18._8_8_ = (double)(long)local_288._8_8_;
    auVar17 = divpd(_DAT_0013b5c0,auVar18);
    dVar13 = (double)local_278._8_8_ * auVar17._8_8_;
    auVar22._0_4_ = -(uint)(local_288._0_4_ == 0);
    auVar22._4_4_ = -(uint)(local_288._4_4_ == 0);
    auVar22._8_4_ = -(uint)(local_288._8_4_ == 0);
    auVar22._12_4_ = -(uint)(local_288._12_4_ == 0);
    auVar19._4_4_ = auVar22._0_4_;
    auVar19._0_4_ = auVar22._4_4_;
    auVar19._8_4_ = auVar22._12_4_;
    auVar19._12_4_ = auVar22._8_4_;
    auVar14._8_4_ = SUB84(dVar13,0);
    auVar14._0_8_ = (double)local_278._0_8_ * auVar17._0_8_;
    auVar14._12_4_ = (int)((ulong)dVar13 >> 0x20);
    auVar14 = ~(auVar19 & auVar22) & auVar14;
    local_80 = auVar14._0_12_;
    uStack_74 = auVar14._12_4_;
    local_a0 = lVar9;
    std::__cxx11::string::_M_assign((string *)&local_e8);
    lVar9 = 0xd8;
    uVar11 = 0;
    do {
      pRVar10 = (reports->
                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar11 + 1;
      if ((ulong)(((long)(reports->
                         super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar10) / 0xb8) <=
          uVar11) goto LAB_0012cfe2;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pRVar10->benchmark_name)._M_dataplus._M_p + lVar9);
      lVar9 = lVar9 + 0xb8;
      bVar7 = std::operator!=(__lhs,&pRVar10->report_label);
    } while (!bVar7);
    std::__cxx11::string::assign((char *)&local_e8);
    pRVar10 = (reports->
              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
              )._M_impl.super__Vector_impl_data._M_start;
LAB_0012cfe2:
    local_1c0._0_8_ = local_1c0 + 0x10;
    local_1c0._8_8_ = 0;
    local_1c0[0x10] = '\0';
    local_1a0._M_p = (pointer)&local_190;
    local_198 = 0;
    local_190._M_local_buf[0] = '\0';
    local_180 = false;
    local_178._M_p = (pointer)&local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_158 = 1;
    local_150 = kNanosecond;
    local_110 = 0;
    local_10c._0_1_ = false;
    local_10c._1_1_ = false;
    local_148 = (undefined1  [16])0x0;
    local_138 = 0.0;
    uStack_130 = 0;
    uStack_12c = 0;
    auStack_128 = SUB1612((undefined1  [16])0x0,4);
    std::operator+(&local_50,&pRVar10->benchmark_name,"_stddev");
    std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::_M_assign((string *)&local_1a0);
    local_158 = 0;
    dVar13 = Stat1<double,_long>::StdDev(&local_208);
    local_148._0_8_ = dVar13;
    dVar13 = Stat1<double,_long>::StdDev(&local_228);
    local_148._8_8_ = dVar13;
    local_138 = Stat1<double,_long>::StdDev(&local_248);
    dVar13 = Stat1<double,_long>::StdDev(&local_268);
    uStack_130 = SUB84(dVar13,0);
    uStack_12c = (undefined4)((ulong)dVar13 >> 0x20);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    push_back(__return_storage_ptr__,(value_type *)local_108);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    push_back(__return_storage_ptr__,(value_type *)local_1c0);
    BenchmarkReporter::Run::~Run((Run *)local_1c0);
    BenchmarkReporter::Run::~Run((Run *)local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BenchmarkReporter::Run> ComputeStats(
    const std::vector<BenchmarkReporter::Run>& reports) {
  typedef BenchmarkReporter::Run Run;
  std::vector<Run> results;

  auto error_count =
      std::count_if(reports.begin(), reports.end(),
                    [](Run const& run) { return run.error_occurred; });

  if (reports.size() - error_count < 2) {
    // We don't report aggregated data if there was a single run.
    return results;
  }
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    if (run.error_occurred) continue;
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time / run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time / run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  Run mean_data;
  mean_data.benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data.iterations = run_iterations;
  mean_data.real_accumulated_time =
      real_accumulated_time_stat.Mean() * run_iterations;
  mean_data.cpu_accumulated_time =
      cpu_accumulated_time_stat.Mean() * run_iterations;
  mean_data.bytes_per_second = bytes_per_second_stat.Mean();
  mean_data.items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data.report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data.report_label = "";
      break;
    }
  }

  Run stddev_data;
  stddev_data.benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data.report_label = mean_data.report_label;
  stddev_data.iterations = 0;
  stddev_data.real_accumulated_time = real_accumulated_time_stat.StdDev();
  stddev_data.cpu_accumulated_time = cpu_accumulated_time_stat.StdDev();
  stddev_data.bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data.items_per_second = items_per_second_stat.StdDev();

  results.push_back(mean_data);
  results.push_back(stddev_data);
  return results;
}